

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_custom_notification_req(raft_server *this,req_msg *req)

{
  type tVar1;
  bool bVar2;
  int iVar3;
  socklen_t *__addr_len;
  element_type *peVar4;
  undefined4 extraout_var;
  element_type *this_00;
  raft_server *this_01;
  size_type sVar5;
  element_type *peVar6;
  req_msg *in_RDX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  buffer *buf_00;
  ptr<resp_msg> pVar7;
  ptr<custom_notification_msg> msg;
  ptr<buffer> buf;
  ptr<log_entry> msg_le;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *log_entries;
  ptr<resp_msg> resp;
  log_entry *in_stack_fffffffffffffe68;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  msg_type *in_stack_fffffffffffffe80;
  unsigned_long *in_stack_fffffffffffffe88;
  ptr<resp_msg> *resp_00;
  ptr<resp_msg> *in_stack_ffffffffffffff30;
  ptr<custom_notification_msg> *in_stack_ffffffffffffff38;
  req_msg *in_stack_ffffffffffffff40;
  raft_server *in_stack_ffffffffffffff48;
  __shared_ptr local_80 [36];
  undefined4 local_5c;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_58;
  undefined8 local_40;
  int32 local_38;
  undefined4 local_34;
  ulong local_30;
  ptr<resp_msg> local_28;
  req_msg *local_18;
  undefined4 extraout_var_00;
  
  local_18 = in_RDX;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d6a55);
  local_30 = srv_state::get_term((srv_state *)0x1d6a5d);
  local_34 = 0x1d;
  __addr_len = (socklen_t *)(in_RSI + 0x38);
  local_38 = msg_base::get_src(&local_18->super_msg_base);
  buf_00 = (buffer *)(in_RSI + 0x2e0);
  peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d6ab1);
  iVar3 = (*peVar4->_vptr_log_store[2])();
  local_40 = CONCAT44(extraout_var,iVar3);
  resp_00 = &local_28;
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (int *)in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->term_);
  this_00 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d6b0f);
  peVar4 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d6b24);
  iVar3 = (*peVar4->_vptr_log_store[2])();
  this_01 = (raft_server *)CONCAT44(extraout_var_00,iVar3);
  resp_msg::accept(this_00,iVar3,__addr,__addr_len);
  local_58 = req_msg::log_entries(local_18);
  sVar5 = std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::size(local_58);
  if (sVar5 == 0) {
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe70,
               (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe68);
    local_5c = 1;
  }
  else {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](local_58,0);
    std::shared_ptr<nuraft::log_entry>::shared_ptr
              ((shared_ptr<nuraft::log_entry> *)in_stack_fffffffffffffe70,
               (shared_ptr<nuraft::log_entry> *)in_stack_fffffffffffffe68);
    std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d6bf0);
    log_entry::get_buf_ptr(in_stack_fffffffffffffe68);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_80);
    if (bVar2) {
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (in_stack_fffffffffffffe70);
      custom_notification_msg::deserialize(buf_00);
      peVar6 = std::
               __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d6c7a);
      tVar1 = peVar6->type_;
      if (tVar1 == out_of_log_range_warning) {
        std::shared_ptr<nuraft::custom_notification_msg>::shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)in_stack_fffffffffffffe70,
                   (shared_ptr<nuraft::custom_notification_msg> *)in_stack_fffffffffffffe68);
        std::shared_ptr<nuraft::resp_msg>::shared_ptr
                  ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe70,
                   (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe68);
        handle_out_of_log_msg
                  (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
        std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d6d2f);
        std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)0x1d6d3c);
      }
      else if (tVar1 == leadership_takeover) {
        std::shared_ptr<nuraft::custom_notification_msg>::shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)in_stack_fffffffffffffe70,
                   (shared_ptr<nuraft::custom_notification_msg> *)in_stack_fffffffffffffe68);
        std::shared_ptr<nuraft::resp_msg>::shared_ptr
                  ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe70,
                   (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe68);
        handle_leadership_takeover
                  (this_01,(req_msg *)this_00,(ptr<custom_notification_msg> *)buf_00,resp_00);
        std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d6ded);
        std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)0x1d6dfa);
      }
      else if (tVar1 == request_resignation) {
        std::shared_ptr<nuraft::custom_notification_msg>::shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)local_18,
                   (shared_ptr<nuraft::custom_notification_msg> *)in_stack_fffffffffffffe68);
        std::shared_ptr<nuraft::resp_msg>::shared_ptr
                  ((shared_ptr<nuraft::resp_msg> *)local_18,
                   (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe68);
        handle_resignation_request
                  (this_01,(req_msg *)this_00,(ptr<custom_notification_msg> *)buf_00,resp_00);
        std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d6eab);
        std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
                  ((shared_ptr<nuraft::custom_notification_msg> *)0x1d6eb8);
      }
      else {
        std::shared_ptr<nuraft::resp_msg>::shared_ptr
                  ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe70,
                   (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe68);
      }
      local_5c = 1;
      std::shared_ptr<nuraft::custom_notification_msg>::~shared_ptr
                ((shared_ptr<nuraft::custom_notification_msg> *)0x1d6f21);
    }
    else {
      std::shared_ptr<nuraft::resp_msg>::shared_ptr
                ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe70,
                 (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe68);
      local_5c = 1;
    }
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1d6f3f);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1d6f4c);
  }
  std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1d6f77);
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_custom_notification_req(req_msg& req) {
    ptr<resp_msg> resp = cs_new<resp_msg>( state_->get_term(),
                                           msg_type::custom_notification_response,
                                           id_,
                                           req.get_src(),
                                           log_store_->next_slot() );
    resp->accept(log_store_->next_slot());

    std::vector< ptr<log_entry> >& log_entries = req.log_entries();
    if (!log_entries.size()) {
        // Empty message, just return.
        return resp;
    }

    ptr<log_entry> msg_le = log_entries[0];
    ptr<buffer> buf = msg_le->get_buf_ptr();
    if (!buf) return resp;

    ptr<custom_notification_msg> msg = custom_notification_msg::deserialize(*buf);

    switch (msg->type_) {
    case custom_notification_msg::out_of_log_range_warning: {
        return handle_out_of_log_msg(req, msg, resp);
    }
    case custom_notification_msg::leadership_takeover: {
        return handle_leadership_takeover(req, msg, resp);
    }
    case custom_notification_msg::request_resignation: {
        return handle_resignation_request(req, msg, resp);
    }
    default:
        break;
    }

    return resp;
}